

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void V_DrawTopBorder(void)

{
  DFrameBuffer *pDVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  FTexture *pFVar8;
  int offset;
  FTexture *p;
  
  iVar4 = viewwidth;
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  if (iVar4 != iVar2) {
    uVar3 = (uint)gameinfo.Border.offset;
    if (viewwindowy < 0x22) {
      V_DrawBorder(0,0,viewwindowx,0x22);
      V_DrawBorder(viewwindowx,0,viewwindowx + viewwidth,viewwindowy);
      iVar4 = viewwindowx + viewwidth;
      iVar2 = DCanvas::GetWidth((DCanvas *)screen);
      V_DrawBorder(iVar4,0,iVar2,0x22);
      pcVar7 = FString::operator_cast_to_char_(&gameinfo.Border.t);
      pFVar8 = FTextureManager::operator()(&TexMan,pcVar7);
      pDVar1 = screen;
      iVar2 = viewwindowy;
      iVar4 = viewwindowx;
      iVar5 = FTexture::GetHeight(pFVar8);
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                (pDVar1,(ulong)(uint)iVar4,(ulong)(uint)(iVar2 - iVar5),
                 (ulong)(uint)(viewwindowx + viewwidth),(ulong)(uint)viewwindowy,pFVar8,1);
      pcVar7 = FString::operator_cast_to_char_(&gameinfo.Border.l);
      pFVar8 = FTextureManager::operator()(&TexMan,pcVar7);
      pDVar1 = screen;
      iVar4 = viewwindowx;
      iVar2 = FTexture::GetWidth(pFVar8);
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                (pDVar1,(ulong)(uint)(iVar4 - iVar2),(ulong)(uint)viewwindowy,
                 (ulong)(uint)viewwindowx,0x23,pFVar8,1);
      pcVar7 = FString::operator_cast_to_char_(&gameinfo.Border.r);
      pFVar8 = FTextureManager::operator()(&TexMan,pcVar7);
      pDVar1 = screen;
      iVar4 = viewwindowy;
      uVar6 = viewwindowx + viewwidth;
      iVar2 = viewwindowx + viewwidth;
      iVar5 = FTexture::GetWidth(pFVar8);
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                (pDVar1,(ulong)uVar6,(ulong)(uint)iVar4,(ulong)(uint)(iVar2 + iVar5),0x23,pFVar8,1);
      pcVar7 = FString::operator_cast_to_char_(&gameinfo.Border.tl);
      pFVar8 = FTextureManager::operator()(&TexMan,pcVar7);
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar8,(double)(int)(viewwindowx - uVar3),
                 (double)(int)(viewwindowy - uVar3),0);
      pcVar7 = FString::operator_cast_to_char_(&gameinfo.Border.tr);
      pFVar8 = FTextureManager::operator()(&TexMan,pcVar7);
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar8,(double)(viewwindowx + viewwidth),
                 (double)(int)(viewwindowy - uVar3),0);
    }
    else {
      iVar4 = DCanvas::GetWidth((DCanvas *)screen);
      V_DrawBorder(0,0,iVar4,0x22);
    }
  }
  return;
}

Assistant:

static void V_DrawTopBorder ()
{
	FTexture *p;
	int offset;

	if (viewwidth == SCREENWIDTH)
		return;

	offset = gameinfo.Border.offset;

	if (viewwindowy < 34)
	{
		V_DrawBorder (0, 0, viewwindowx, 34);
		V_DrawBorder (viewwindowx, 0, viewwindowx + viewwidth, viewwindowy);
		V_DrawBorder (viewwindowx + viewwidth, 0, SCREENWIDTH, 34);
		p = TexMan(gameinfo.Border.t);
		screen->FlatFill(viewwindowx, viewwindowy - p->GetHeight(),
						 viewwindowx + viewwidth, viewwindowy, p, true);

		p = TexMan(gameinfo.Border.l);
		screen->FlatFill(viewwindowx - p->GetWidth(), viewwindowy,
						 viewwindowx, 35, p, true);
		p = TexMan(gameinfo.Border.r);
		screen->FlatFill(viewwindowx + viewwidth, viewwindowy,
						 viewwindowx + viewwidth + p->GetWidth(), 35, p, true);

		p = TexMan(gameinfo.Border.tl);
		screen->DrawTexture (p, viewwindowx - offset, viewwindowy - offset, TAG_DONE);

		p = TexMan(gameinfo.Border.tr);
		screen->DrawTexture (p, viewwindowx + viewwidth, viewwindowy - offset, TAG_DONE);
	}
	else
	{
		V_DrawBorder (0, 0, SCREENWIDTH, 34);
	}
}